

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O3

void __thiscall setup::version::load(version *this,istream *is)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 *puVar7;
  char cVar8;
  long lVar9;
  long *plVar10;
  bool bVar11;
  _WordT _Var12;
  ulong uVar13;
  ulong uVar14;
  long *plVar15;
  long *plVar16;
  bool bVar17;
  stored_legacy_version legacy_version;
  string version_str;
  stored_version version_string;
  char local_b4;
  undefined1 uStack_b3;
  char cStack_b2;
  undefined1 uStack_b1;
  char cStack_b0;
  undefined2 uStack_af;
  char cStack_ad;
  undefined4 local_ac;
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  uint local_84;
  version *local_80;
  long *local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_60;
  undefined1 local_5c;
  undefined1 local_38 [8];
  
  std::istream::read((char *)is,(long)&local_b4);
  if ((local_b4 != 'i') || (local_ac._3_1_ != '\x1a')) {
    local_70 = CONCAT44(local_70._4_4_,local_ac);
    local_78 = (long *)CONCAT17(cStack_ad,
                                CONCAT25(uStack_af,
                                         CONCAT14(cStack_b0,
                                                  CONCAT13(uStack_b1,
                                                           CONCAT12(cStack_b2,
                                                                    CONCAT11(uStack_b3,local_b4)))))
                               );
    std::istream::read((char *)is,(long)&local_70 + 4);
    lVar9 = 0;
    do {
      if (((&(anonymous_namespace)::versions)[lVar9] != '\0') &&
         (iVar4 = bcmp(&local_78,&(anonymous_namespace)::versions + lVar9,0x40), iVar4 == 0)) {
        this->value = *(version_constant *)((long)&DAT_001741b0 + lVar9);
        _Var12 = *(_WordT *)((long)&DAT_001741b8 + lVar9);
        goto LAB_0014309f;
      }
      lVar9 = lVar9 + 0x50;
    } while (lVar9 != 0x23a0);
    local_a8 = (long *)((ulong)local_a8 & 0xffffffffffffff00);
    pcVar5 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (&local_78,local_38);
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a8,&local_78,pcVar5);
    if (local_a0 != 0) {
      plVar10 = local_a8;
      uVar6 = local_a0;
      do {
        uVar6 = uVar6 - 1;
        uVar13 = 0;
        do {
          uVar14 = uVar13;
          if ((*(char *)((long)plVar10 + uVar13) != "Inno Setup"[uVar13]) ||
             (uVar14 = uVar13 + 1, uVar6 == uVar13)) break;
          bVar17 = uVar13 != 9;
          uVar13 = uVar14;
        } while (bVar17);
        if (uVar14 == 10) {
          if (plVar10 != (long *)((long)plVar10 + uVar14)) {
            this->value = 0;
            local_80 = this;
            lVar9 = std::__cxx11::string::find((char)&local_a8,0x28);
            if (lVar9 == -1) goto LAB_00142fe5;
            goto LAB_00142e43;
          }
          break;
        }
        plVar10 = (long *)((long)plVar10 + 1);
      } while (plVar10 != (long *)((long)local_a8 + local_a0));
    }
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_00170358;
    __cxa_throw(puVar7,&version_error::typeinfo,std::exception::~exception);
  }
  lVar9 = 0;
  bVar17 = true;
  do {
    bVar11 = bVar17;
    if ((&DAT_00174138)[lVar9 * 8] == local_ac &&
        (&(anonymous_namespace)::legacy_versions)[lVar9 * 4] ==
        CONCAT17(cStack_ad,
                 CONCAT25(uStack_af,
                          CONCAT14(cStack_b0,
                                   CONCAT13(uStack_b1,CONCAT12(cStack_b2,CONCAT11(uStack_b3,0x69))))
                         ))) {
      this->value = (&DAT_00174140)[lVar9 * 8];
      _Var12 = (&DAT_00174148)[lVar9 * 4];
LAB_0014309f:
      (this->variant)._flags.super__Base_bitset<1UL>._M_w = _Var12;
      this->known = true;
      return;
    }
    lVar9 = 1;
    bVar17 = false;
  } while (bVar11);
  if ((((cStack_b2 != '.') || (cStack_b0 != '.')) || (cStack_ad != '-')) || ((char)local_ac != '-'))
  {
LAB_00143201:
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_00170358;
    __cxa_throw(puVar7,&version_error::typeinfo,std::exception::~exception);
  }
  _Var12 = 1;
  if (local_ac._2_1_ != '6' || local_ac._1_1_ != '1') {
    if ((local_ac._1_1_ != '3') || (local_ac._2_1_ != '2')) goto LAB_00143201;
    _Var12 = 0;
  }
  (this->variant)._flags.super__Base_bitset<1UL>._M_w = _Var12;
  local_68 = CONCAT17(0x2d,CONCAT25(uStack_af,
                                    CONCAT14(0x2e,CONCAT13(uStack_b1,
                                                           CONCAT12(0x2e,CONCAT11(uStack_b3,0x69))))
                                   ));
  local_60 = local_ac;
  local_70 = 0xc;
  local_5c = 0;
  local_78 = &local_68;
  uVar1 = util::to_unsigned((char *)((long)&local_68 + 1),1);
  uVar2 = util::to_unsigned((char *)((long)local_78 + 3),1);
  uVar3 = util::to_unsigned((char *)((long)local_78 + 5),2);
  this->value = uVar3 << 8 | uVar2 << 0x10 | uVar1 << 0x18;
  this->known = false;
  local_98[0] = local_68;
  plVar10 = local_78;
  if (local_78 == &local_68) {
    return;
  }
  goto LAB_0014317e;
LAB_00142e43:
  do {
    uVar6 = lVar9 + 1;
    if (((5 < local_a0 - lVar9) &&
        (lVar9 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x159624,uVar6),
        lVar9 != -1)) && (*(char *)((long)local_a8 + lVar9) == '.')) {
      local_84 = util::to_unsigned((char *)((long)local_a8 + uVar6),lVar9 - uVar6);
      uVar6 = lVar9 + 1;
      lVar9 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x159624,uVar6);
      if ((lVar9 != -1) && (*(char *)((long)local_a8 + lVar9) == '.')) {
        uVar1 = util::to_unsigned((char *)((long)local_a8 + uVar6),lVar9 - uVar6);
        uVar13 = lVar9 + 1;
        uVar6 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x159624,uVar13);
        if (uVar6 != 0xffffffffffffffff) {
          uVar2 = util::to_unsigned((char *)(uVar13 + (long)local_a8),uVar6 - uVar13);
          cVar8 = *(char *)((long)local_a8 + uVar6);
          if (cVar8 == 'a') {
            uVar6 = uVar6 + 1;
            if (local_a0 <= uVar6) goto LAB_00142fa5;
            cVar8 = *(char *)((long)local_a8 + uVar6);
          }
          uVar3 = 0;
          if (cVar8 == '.') {
            uVar6 = uVar6 + 1;
            lVar9 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x159624,uVar6);
            uVar3 = 0;
            if (lVar9 - uVar6 != 0 && lVar9 != -1) {
              uVar3 = util::to_unsigned((char *)(uVar6 + (long)local_a8),lVar9 - uVar6);
            }
          }
          uVar1 = uVar2 << 8 | uVar1 << 0x10 | local_84 << 0x18 | uVar3;
          if (uVar1 < local_80->value) {
            uVar1 = local_80->value;
          }
          local_80->value = uVar1;
        }
      }
    }
LAB_00142fa5:
    lVar9 = std::__cxx11::string::find((char)&local_a8,0x28);
  } while (lVar9 != -1);
LAB_00142fe5:
  uVar1 = local_80->value;
  if (uVar1 == 0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_00170358;
    __cxa_throw(puVar7,&version_error::typeinfo,std::exception::~exception);
  }
  (local_80->variant)._flags.super__Base_bitset<1UL>._M_w = 0;
  if (uVar1 < 0x6030000) {
    if (local_a0 != 0) {
      plVar10 = local_a8;
      uVar6 = local_a0;
      do {
        uVar6 = uVar6 - 1;
        uVar13 = 0;
        do {
          uVar14 = uVar13;
          if ((*(char *)((long)plVar10 + uVar13) != "(u)"[uVar13]) ||
             (uVar14 = uVar13 + 1, uVar6 == uVar13)) break;
          bVar17 = uVar13 != 2;
          uVar13 = uVar14;
        } while (bVar17);
        plVar16 = local_a8;
        uVar13 = local_a0;
        if (uVar14 == 3) {
          if (plVar10 != (long *)((long)plVar10 + uVar14)) goto LAB_00143013;
          break;
        }
        plVar10 = (long *)((long)plVar10 + 1);
      } while (plVar10 != (long *)((long)local_a8 + local_a0));
      do {
        uVar6 = 0;
        do {
          uVar14 = uVar6;
          if ((*(char *)((long)plVar16 + uVar6) != "(U)"[uVar6]) ||
             (uVar14 = uVar6 + 1, uVar13 - 1 == uVar6)) break;
          bVar17 = uVar6 != 2;
          uVar6 = uVar14;
        } while (bVar17);
        if (uVar14 == 3) {
          if (plVar16 != (long *)((long)plVar16 + uVar14)) goto LAB_00143013;
          break;
        }
        plVar16 = (long *)((long)plVar16 + 1);
        uVar13 = uVar13 - 1;
      } while (plVar16 != (long *)((long)local_a8 + local_a0));
      _Var12 = 4;
      goto LAB_00143020;
    }
  }
  else {
LAB_00143013:
    (local_80->variant)._flags.super__Base_bitset<1UL>._M_w = 2;
    _Var12 = 6;
LAB_00143020:
    if (local_a0 != 0) {
      plVar10 = (long *)((long)local_a8 + local_a0);
      plVar16 = local_a8;
      uVar6 = local_a0;
      do {
        uVar6 = uVar6 - 1;
        uVar13 = 0;
        do {
          uVar14 = uVar13;
          if ((*(char *)((long)plVar16 + uVar13) != "My Inno Setup Extensions"[uVar13]) ||
             (uVar14 = uVar13 + 1, uVar6 == uVar13)) break;
          bVar17 = uVar13 != 0x17;
          uVar13 = uVar14;
        } while (bVar17);
        plVar15 = local_a8;
        if (uVar14 == 0x18) {
          if (plVar16 != (long *)((long)plVar16 + uVar14)) goto LAB_00143166;
          break;
        }
        plVar16 = (long *)((long)plVar16 + 1);
      } while (plVar16 != plVar10);
      do {
        local_a0 = local_a0 - 1;
        uVar6 = 0;
        do {
          uVar13 = uVar6;
          if ((*(char *)((long)plVar15 + uVar6) != "with ISX"[uVar6]) ||
             (uVar13 = uVar6 + 1, local_a0 == uVar6)) break;
          bVar17 = uVar6 != 7;
          uVar6 = uVar13;
        } while (bVar17);
        if (uVar13 == 8) {
          if (plVar15 != (long *)((long)plVar15 + uVar13)) {
LAB_00143166:
            (local_80->variant)._flags.super__Base_bitset<1UL>._M_w = _Var12;
          }
          break;
        }
        plVar15 = (long *)((long)plVar15 + 1);
      } while (plVar15 != plVar10);
    }
  }
  local_80->known = false;
  plVar10 = local_a8;
  if (local_a8 == local_98) {
    return;
  }
LAB_0014317e:
  operator_delete(plVar10,local_98[0] + 1);
  return;
}

Assistant:

void version::load(std::istream & is) {
	
	static const char digits[] = "0123456789";
	
	BOOST_STATIC_ASSERT(sizeof(stored_legacy_version) <= sizeof(stored_version));
	
	stored_legacy_version legacy_version;
	is.read(legacy_version, std::streamsize(sizeof(legacy_version)));
	
	if(legacy_version[0] == 'i' && legacy_version[sizeof(legacy_version) - 1] == '\x1a') {
		
		for(size_t i = 0; i < size_t(boost::size(legacy_versions)); i++) {
			if(!memcmp(legacy_version, legacy_versions[i].name, sizeof(legacy_version))) {
				value = legacy_versions[i].version;
				variant = legacy_versions[i].variant;
				known = true;
				debug("known legacy version: \"" << versions[i].name << '"');
				return;
			}
		}
		
		debug("unknown legacy version: \""
		      << std::string(legacy_version, sizeof(legacy_version)) << '"');
		
		if(legacy_version[0] != 'i' || legacy_version[2] != '.' || legacy_version[4] != '.'
		   || legacy_version[7] != '-' || legacy_version[8] != '-') {
			throw version_error();
		}
		
		if(legacy_version[9] == '1' && legacy_version[10] == '6') {
			variant = Bits16;
		} else if(legacy_version[9] == '3' && legacy_version[10] == '2') {
			variant = 0;
		} else {
			throw version_error();
		}
		
		std::string version_str(legacy_version, sizeof(legacy_version));
		
		try {
			unsigned a = util::to_unsigned(version_str.data() + 1, 1);
			unsigned b = util::to_unsigned(version_str.data() + 3, 1);
			unsigned c = util::to_unsigned(version_str.data() + 5, 2);
			value = INNO_VERSION(a, b, c);
		} catch(const boost::bad_lexical_cast &) {
			throw version_error();
		}
		
		known = false;
		
		return;
	}
	
	stored_version version_string;
	BOOST_STATIC_ASSERT(sizeof(legacy_version) <= sizeof(version_string));
	memcpy(version_string, legacy_version, sizeof(legacy_version));
	is.read(version_string + sizeof(legacy_version),
	        std::streamsize(sizeof(version_string) - sizeof(legacy_version)));
	
	
	for(size_t i = 0; i < size_t(boost::size(versions)); i++) {
		if(versions[i].name[0] != '\0' && !memcmp(version_string, versions[i].name, sizeof(version_string))) {
			value = versions[i].version;
			variant = versions[i].variant;
			known = true;
			debug("known version: \"" << versions[i].name << '"');
			return;
		}
	}
	
	char * end = std::find(version_string, version_string + boost::size(version_string), '\0');
	std::string version_str(version_string, end);
	debug("unknown version: \"" << version_str << '"');
	if(!boost::contains(version_str, "Inno Setup")) {
		throw version_error();
	}
	
	value = 0;
	size_t bracket = version_str.find('(');
	for(; bracket != std::string::npos; bracket = version_str.find('(', bracket + 1)) {
		
		if(version_str.length() - bracket < 6) {
			continue;
		}
		
		try {
			
			size_t a_start = bracket + 1;
			size_t a_end = version_str.find_first_not_of(digits, a_start);
			if(a_end == std::string::npos || version_str[a_end] != '.') {
				continue;
			}
			unsigned a = util::to_unsigned(version_str.data() + a_start, a_end - a_start);
			
			size_t b_start = a_end + 1;
			size_t b_end = version_str.find_first_not_of(digits, b_start);
			if(b_end == std::string::npos || version_str[b_end] != '.') {
				continue;
			}
			unsigned b = util::to_unsigned(version_str.data() + b_start, b_end - b_start);
			
			size_t c_start = b_end + 1;
			size_t c_end = version_str.find_first_not_of(digits, c_start);
			if(c_end == std::string::npos) {
				continue;
			}
			unsigned c = util::to_unsigned(version_str.data() + c_start, c_end - c_start);
			
			size_t d_start = c_end;
			if(version_str[d_start] == 'a') {
				if(d_start + 1 >= version_str.length()) {
					continue;
				}
				d_start++;
			}
			
			unsigned d = 0;
			if(version_str[d_start] == '.') {
				d_start++;
				size_t d_end = version_str.find_first_not_of(digits, d_start);
				if(d_end != std::string::npos && d_end != d_start) {
					d = util::to_unsigned(version_str.data() + d_start, d_end - d_start);
				}
			}
			
			value = std::max(value, INNO_VERSION_EXT(a, b, c, d));
			
		} catch(const boost::bad_lexical_cast &) {
			continue;
		}
	}
	if(!value) {
		throw version_error();
	}
	
	variant = 0;
	if(value >= INNO_VERSION(6, 3, 0) ||
	   boost::contains(version_str, "(u)") || boost::contains(version_str, "(U)")) {
		variant |= Unicode;
	}
	if(boost::contains(version_str, "My Inno Setup Extensions") || boost::contains(version_str, "with ISX")) {
		variant |= ISX;
	}
	
	known = false;
}